

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corealloc.h
# Opt level: O3

void __thiscall
snmalloc::Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>>::
Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>,void>
          (Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>> *this,
          Range<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>_>
          *spare)

{
  undefined1 auVar1 [16];
  long lVar2;
  Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>> *pAVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  
  memset(this,0,0x419);
  lVar2 = 0x420;
  do {
    *(undefined8 *)(this + lVar2) = 0;
    *(undefined8 *)(this + lVar2 + 8) = 0;
    lVar2 = lVar2 + 0x18;
  } while (lVar2 != 0x1c20);
  *(undefined8 *)(this + 0x1c28) = 0;
  lVar2 = 0x1c30;
  do {
    *(Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>> **)
     (this + lVar2) = this + lVar2;
    *(Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>> **)
     (this + lVar2 + 8) = this + lVar2;
    *(undefined4 *)(this + lVar2 + 0x10) = 0;
    lVar2 = lVar2 + 0x18;
  } while (lVar2 != 0x2038);
  *(Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>> **)
   (this + 0x2038) = this + 0x2038;
  *(Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>> **)
   (this + 0x2040) = this + 0x2038;
  *(undefined8 *)(this + 0x2048) = 0;
  *(undefined8 *)(this + 0x2050) = 0;
  *(undefined8 *)(this + 0x2058) = 0;
  *(undefined8 *)(this + 0x2060) = 0;
  lVar2 = 0;
  *(undefined8 *)(this + 0x2068) = 0;
  *(undefined8 *)(this + 0x2100) = 0;
  *(undefined8 *)(this + 0x2140) = 0;
  memset(this + 0x2200,0,0xf0);
  pAVar3 = this + 0x2248;
  do {
    auVar4._8_4_ = (int)lVar2;
    auVar4._0_8_ = lVar2;
    auVar4._12_4_ = (int)((ulong)lVar2 >> 0x20);
    auVar4 = (auVar4 | _DAT_0010f000) ^ _DAT_0010f010;
    if (auVar4._4_4_ == -0x80000000 && auVar4._0_4_ < -0x7ffffff9) {
      *(undefined8 *)(pAVar3 + -0x20) = 0;
      *(undefined8 *)pAVar3 = 0;
    }
    lVar2 = lVar2 + 2;
    pAVar3 = pAVar3 + 0x40;
  } while (lVar2 != 8);
  lVar2 = 0;
  memset(this + 0x22f0,0,0x638);
  auVar1 = _DAT_0010f010;
  auVar4 = _DAT_0010f000;
  pAVar3 = this + 0x2340;
  do {
    auVar5._8_4_ = (int)lVar2;
    auVar5._0_8_ = lVar2;
    auVar5._12_4_ = (int)((ulong)lVar2 >> 0x20);
    auVar5 = (auVar5 | auVar4) ^ auVar1;
    if (auVar5._4_4_ == -0x80000000 && auVar5._0_4_ < -0x7fffffcf) {
      *(undefined8 *)(pAVar3 + -0x20) = 0;
      *(undefined8 *)pAVar3 = 0;
    }
    lVar2 = lVar2 + 2;
    pAVar3 = pAVar3 + 0x40;
  } while (lVar2 != 0x32);
  memset(this + 0x2928,0,0x148);
  lVar2 = 0x2930;
  do {
    *(undefined1 (*) [16])(this + lVar2) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])(this + lVar2 + 0x10) = (undefined1  [16])0x0;
    lVar2 = lVar2 + 0x20;
  } while (lVar2 != 0x2a70);
  *(undefined8 *)(this + 0x2a70) = 0;
  *(undefined8 *)(this + 0x2a78) = 1;
  *(undefined8 *)(this + 0x2a80) = 1;
  *(undefined8 *)(this + 0x2a88) = 0;
  Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>::init
            ((Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *)
             this,(EVP_PKEY_CTX *)spare);
  return;
}

Assistant:

Allocator(Range<capptr::bounds::Alloc>& spare)
    {
      init(spare);
    }